

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.cpp
# Opt level: O3

string * anon_unknown.dwarf_9a77::scrape_type_text(xml_node node)

{
  bool bVar1;
  int iVar2;
  char_t *pcVar3;
  undefined7 extraout_var;
  string *extraout_RAX;
  string *in_RDI;
  char *__s;
  xml_node in_stack_ffffffffffffff58;
  xml_node local_a0;
  xml_node_struct *local_98;
  xml_node_struct *pxStack_90;
  undefined1 local_88 [32];
  char local_68 [16];
  xml_node_iterator local_58;
  xml_node_iterator local_48;
  string *psVar4;
  
  pugi::xml_node::name(&local_a0);
  local_98 = (xml_node_struct *)local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"apientry","");
  iVar2 = std::__cxx11::string::compare((char *)&local_98);
  if (local_98 != (xml_node_struct *)local_88) {
    operator_delete(local_98);
  }
  if (iVar2 == 0) {
    (in_RDI->super_string)._M_dataplus._M_p = (pointer)&(in_RDI->super_string).field_2;
    std::__cxx11::string::_M_construct<char_const*>();
    psVar4 = extraout_RAX;
  }
  else {
    pcVar3 = pugi::xml_node::value(&local_a0);
    __s = "";
    if (pcVar3 != (char_t *)0x0) {
      __s = pcVar3;
    }
    (in_RDI->super_string)._M_dataplus._M_p = (pointer)&(in_RDI->super_string).field_2;
    strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>();
    pugi::xml_node::children(&local_a0);
    local_48._wrap._root = local_98;
    local_48._parent._root = pxStack_90;
    local_58._wrap._root = (xml_node_struct *)local_88._0_8_;
    local_58._parent._root = (xml_node_struct *)local_88._8_8_;
    while( true ) {
      bVar1 = pugi::xml_node_iterator::operator!=(&local_48,&local_58);
      psVar4 = (string *)CONCAT71(extraout_var,bVar1);
      if (!bVar1) break;
      pugi::xml_node_iterator::operator*(&local_48);
      scrape_type_text(in_stack_ffffffffffffff58);
      wire::string::operator<<(in_RDI,(string *)(local_88 + 0x10));
      if ((char *)local_88._16_8_ != local_68) {
        operator_delete((void *)local_88._16_8_);
      }
      pugi::xml_node_iterator::operator++(&local_48);
    }
  }
  return psVar4;
}

Assistant:

wire::string scrape_type_text(const pugi::xml_node node)
{
  if (node.name() == wire::string("apientry"))
    return "GLAPIENTRY";

  wire::string result = node.value();

  for (const pugi::xml_node child : node.children())
    result += scrape_type_text(child);

  return result;
}